

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwHideWindow(GLFWwindow *handle)

{
  _GLFWwindow *window;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (*(long *)(handle + 0x48) != 0) {
    return;
  }
  XUnmapWindow(_glfw.x11.display,*(undefined8 *)(handle + 0x350));
  XFlush(_glfw.x11.display);
  return;
}

Assistant:

GLFWAPI void glfwHideWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformHideWindow(window);
}